

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

int __thiscall google::protobuf::io::CopyingInputStream::Skip(CopyingInputStream *this,int count)

{
  uint *puVar1;
  unsigned_long local_1040;
  int local_1038;
  int local_1034;
  int local_1030;
  int local_102c;
  int bytes;
  int skipped;
  char junk [4096];
  int count_local;
  CopyingInputStream *this_local;
  
  local_102c = 0;
  while( true ) {
    if (count <= local_102c) {
      return local_102c;
    }
    local_1034 = count - local_102c;
    local_1040 = 0x1000;
    local_1038 = internal::implicit_cast<int,unsigned_long>(&local_1040);
    puVar1 = (uint *)std::min<int>(&local_1034,&local_1038);
    local_1030 = (*this->_vptr_CopyingInputStream[2])(this,&bytes,(ulong)*puVar1);
    if (local_1030 < 1) break;
    local_102c = local_1030 + local_102c;
  }
  return local_102c;
}

Assistant:

int CopyingInputStream::Skip(int count) {
  char junk[4096];
  int skipped = 0;
  while (skipped < count) {
    int bytes =
        Read(junk, std::min(count - skipped, implicit_cast<int>(sizeof(junk))));
    if (bytes <= 0) {
      // EOF or read error.
      return skipped;
    }
    skipped += bytes;
  }
  return skipped;
}